

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::writeLinearized(QPDFWriter *this)

{
  undefined *puVar1;
  int hint_id;
  bool bVar2;
  int objid;
  int size;
  pointer pQVar3;
  size_type sVar4;
  bool bVar5;
  __single_object _Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  QPDFObjGen QVar12;
  string *idx;
  Pl_StdioFile *this_00;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar13;
  Object *pOVar14;
  NewObject *pNVar15;
  string *psVar16;
  qpdf_offset_t hint_offset;
  size_type *psVar17;
  element_type *peVar18;
  size_type *psVar19;
  long *plVar20;
  logic_error *plVar21;
  runtime_error *this_01;
  int iVar22;
  uint max_id;
  string *psVar23;
  string *psVar24;
  size_t __n;
  ulong uVar26;
  int iVar27;
  uint max_id_00;
  string *psVar28;
  size_type *psVar29;
  QPDFObjectHandle *oh_1;
  ulong uVar30;
  pointer pQVar31;
  ulong uVar32;
  Count *pCVar33;
  int iVar34;
  uint uVar35;
  QPDFObjectHandle *oh;
  size_type sVar36;
  int iVar37;
  uint uVar38;
  bool bVar39;
  int i;
  long lVar40;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link;
  long lVar41;
  undefined *nspaces;
  size_type *__val;
  uint uVar42;
  type ii_1;
  size_t sVar43;
  string __str;
  string *local_2b8;
  FILE *local_2b0;
  qpdf_offset_t local_298;
  __single_object pp_pass1;
  size_type local_278;
  __single_object pp_md5;
  int local_268;
  pointer local_260;
  size_type local_258;
  size_type local_248;
  size_type local_230;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_218;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_210;
  string hint_buffer;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part6;
  QPDFObjectHandle local_1c8;
  QPDFObjectHandle local_1b8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part9;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> part7;
  int local_120 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *vecs2 [3];
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> stream_cache;
  long lVar25;
  
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &stream_cache._M_t._M_impl.super__Rb_tree_header._M_header;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c0._8_8_ = &stream_cache;
  local_a8 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc:2580:35)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc:2580:35)>
             ::_M_manager;
  local_c0._M_unused._M_object = this;
  stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       stream_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDF::Writer::optimize(peVar18->pdf,&peVar18->obj,(function<int_(QPDFObjectHandle_&)> *)&local_c0)
  ;
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  pvVar13 = &part4;
  part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDF::getLinearizedParts(peVar18->pdf,&peVar18->obj,pvVar13,&part6,&part7,&part8,&part9);
  uVar30 = ((long)part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)part9.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) +
           ((long)part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)part8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) +
           ((long)part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)part7.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4);
  if ((uVar30 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar30);
  }
  iVar27 = (int)uVar30 + 1;
  peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar18->next_objid = iVar27;
  bVar2 = (peVar18->obj).streams_empty;
  local_268 = 0;
  if (bVar2 == false) {
    peVar18->next_objid = (int)uVar30 + 2;
    local_268 = iVar27;
  }
  vecs2[0] = &part7;
  vecs2[1] = &part8;
  vecs2[2] = &part9;
  lVar40 = 0;
  do {
    pQVar3 = (vecs2[lVar40]->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pQVar31 = (vecs2[lVar40]->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_start; pQVar31 != pQVar3; pQVar31 = pQVar31 + 1) {
      QVar12 = QPDFObjectHandle::getObjGen(pQVar31);
      assignCompressedObjectNumbers(this,QVar12);
    }
    lVar40 = lVar40 + 1;
  } while (lVar40 != 3);
  peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  objid = peVar18->next_objid;
  iVar10 = objid + 2;
  if (bVar2 != false) {
    iVar10 = objid + 1;
  }
  peVar18->next_objid = iVar10;
  uVar30 = (long)part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  iVar34 = iVar10;
  if (0x7fffffff < uVar30) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar30);
    peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar34 = peVar18->next_objid;
  }
  iVar34 = (int)uVar30 + iVar34;
  peVar18->next_objid = iVar34;
  hint_id = iVar34;
  if (peVar18->encrypted == true) {
    hint_id = iVar34 + 1;
    peVar18->next_objid = hint_id;
    peVar18->encryption_dict_objid = iVar34;
  }
  iVar22 = hint_id + 1;
  peVar18->next_objid = iVar22;
  uVar30 = (long)part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  iVar37 = iVar22;
  if ((uVar30 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar30);
    peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar37 = peVar18->next_objid;
  }
  max_id_00 = objid - 1;
  iVar37 = (int)uVar30 + iVar37;
  peVar18->next_objid = iVar37;
  bVar5 = true;
  do {
    bVar39 = bVar5;
    pQVar3 = (pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pQVar31 = (pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start; pQVar31 != pQVar3;
        pQVar31 = pQVar31 + 1) {
      QVar12 = QPDFObjectHandle::getObjGen(pQVar31);
      assignCompressedObjectNumbers(this,QVar12);
    }
    pvVar13 = &part6;
    bVar5 = false;
  } while (bVar39);
  size = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         next_objid;
  iVar8 = QPDFObjectHandle::getObjectID
                    (part4.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1);
  iVar9 = QPDFObjectHandle::getObjectID
                    (part6.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1);
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_objid
       = iVar10;
  enqueuePart(this,&part4);
  peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar18->next_objid == iVar34) {
    peVar18->next_objid = iVar22;
    enqueuePart(this,&part6);
    peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar18->next_objid == iVar37) {
      peVar18->next_objid = 1;
      enqueuePart(this,&part7);
      enqueuePart(this,&part8);
      enqueuePart(this,&part9);
      if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          next_objid == iVar27) {
        hint_buffer._M_dataplus._M_p = (pointer)&hint_buffer.field_2;
        hint_buffer._M_string_length = 0;
        hint_buffer.field_2._M_local_buf[0] = '\0';
        pp_pass1._M_t.
        super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
        ._M_t.
        super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
        .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
             (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
              )operator_new(0x10);
        *(QPDFWriter **)
         pp_pass1._M_t.
         super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
         ._M_t.
         super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
         .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl = this;
        *(undefined8 *)
         ((long)pp_pass1._M_t.
                super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                ._M_t.
                super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl + 8) = 0;
        pp_md5._M_t.
        super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
        ._M_t.
        super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
        .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
             (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
              )operator_new(0x10);
        max_id = size - 1;
        *(QPDFWriter **)
         pp_md5._M_t.
         super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
         ._M_t.
         super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
         .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl = this;
        *(undefined8 *)
         ((long)pp_md5._M_t.
                super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                ._M_t.
                super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl + 8) = 0;
        local_120[0] = 1;
        local_120[1] = 2;
        idx = (string *)(long)hint_id;
        local_298 = 0;
        local_230 = 0;
        local_248 = 0;
        local_278 = 0;
        sVar36 = 0;
        local_260 = (pointer)0x0;
        local_258 = 0;
        local_2b8 = (string *)0x0;
        local_2b0 = (FILE *)0x0;
        lVar40 = 0;
        do {
          iVar27 = *(int *)((long)local_120 + lVar40);
          if (iVar27 == 1) {
            peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            if ((peVar18->lin_pass1_filename)._M_string_length == 0) {
              local_218._M_t.
              super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
              super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
                   (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
                   (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
              link = &local_218;
              activatePipelineStack
                        (this,(PipelinePopper *)
                              pp_pass1._M_t.
                              super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                              _M_head_impl,true,(string *)0x0,
                         (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)link);
            }
            else {
              local_2b0 = (FILE *)QUtil::safe_fopen((peVar18->lin_pass1_filename)._M_dataplus._M_p,
                                                    "wb");
              this_00 = (Pl_StdioFile *)operator_new(0x38);
              Pl_StdioFile::Pl_StdioFile(this_00,"linearization pass1",(FILE *)local_2b0);
              pushPipeline(this,(Pipeline *)this_00);
              local_210._M_t.
              super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
              super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
                   (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
                   (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
              link = &local_210;
              activatePipelineStack
                        (this,(PipelinePopper *)
                              pp_pass1._M_t.
                              super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                              .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                              _M_head_impl,false,(string *)0x0,
                         (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)link);
            }
            std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                      ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)link);
            if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->deterministic_id == true) {
              pushMD5Pipeline(this,(PipelinePopper *)
                                   pp_md5._M_t.
                                   super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                   .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                                   _M_head_impl);
            }
          }
          writeHeader(this);
          pCVar33 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pipeline;
          psVar23 = pCVar33->str;
          psVar19 = (size_type *)&pCVar33->count;
          if (psVar23 != (string *)0x0) {
            psVar19 = &psVar23->_M_string_length;
          }
          sVar4 = *psVar19;
          openObject(this,objid);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x27a8f2,(void *)0x2,(size_t)psVar23);
          if (iVar27 == 2) {
            pvVar13 = QPDF::getAllPages(((this->m).
                                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->pdf);
            pQVar31 = (pvVar13->
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((pvVar13->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_finish == pQVar31) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
            }
            peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            local_1b8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pQVar31->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_1b8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (pQVar31->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_1b8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_1b8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_1b8.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            iVar10 = QPDFObjectHandle::getObjectID(&local_1b8);
            uVar32 = (ulong)iVar10;
            lVar25 = *(long *)&(peVar18->obj).super_ObjTable<QPDFWriter::Object>.
                               super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                               .
                               super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                               ._M_impl;
            uVar30 = ((long)*(pointer *)
                             ((long)&(peVar18->obj).super_ObjTable<QPDFWriter::Object>.
                                     super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                     .
                                     super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                             + 8) - lVar25 >> 2) * -0x5555555555555555;
            if (uVar30 < uVar32 || uVar30 - uVar32 == 0) {
              pOVar14 = ObjTable<QPDFWriter::Object>::large_element
                                  (&(peVar18->obj).super_ObjTable<QPDFWriter::Object>,uVar32);
            }
            else {
              uVar30 = uVar32 * 3;
              pOVar14 = (Object *)(lVar25 + uVar32 * 0xc);
            }
            uVar35 = pOVar14->renumber;
            if (local_1b8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b8.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            uVar32 = (long)(pvVar13->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar13->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4;
            if ((uVar32 & 0xffffffff80000000) != 0) {
              QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar32);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27ae3c,(void *)0x12,uVar30);
            psVar23 = (string *)((long)&(local_2b8->_M_dataplus)._M_p + local_230);
            psVar24 = (string *)-(long)psVar23;
            if (0 < (long)psVar23) {
              psVar24 = psVar23;
            }
            uVar38 = 1;
            psVar16 = local_2b8;
            if ((string *)0x9 < psVar24) {
              psVar16 = psVar24;
              uVar42 = 4;
              do {
                uVar38 = uVar42;
                if (psVar16 < (string *)0x64) {
                  uVar38 = uVar38 - 2;
                  goto LAB_001f0b9a;
                }
                if (psVar16 < (string *)0x3e8) {
                  uVar38 = uVar38 - 1;
                  goto LAB_001f0b9a;
                }
                if (psVar16 < (string *)0x2710) goto LAB_001f0b9a;
                psVar28 = (string *)((ulong)psVar16 / 10000);
                bVar5 = (string *)0x1869f < psVar16;
                psVar16 = psVar28;
                uVar42 = uVar38 + 4;
              } while (bVar5);
              uVar38 = uVar38 + 1;
            }
LAB_001f0b9a:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar38 - (char)((long)psVar23 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar23 >> 0x3f),uVar38,
                       (unsigned_long_long)psVar24);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27ae4f,(void *)0x6,(size_t)psVar16);
            peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            lVar25 = *(long *)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            psVar23 = (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar25 >> 5);
            if (idx < psVar23) {
              pNVar15 = (NewObject *)(lVar25 + (long)idx * 0x20);
            }
            else {
              pNVar15 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            psVar16 = (string *)QPDFXRefEntry::getOffset(&pNVar15->xref);
            psVar24 = (string *)-(long)psVar16;
            if (0 < (long)psVar16) {
              psVar24 = psVar16;
            }
            uVar38 = 1;
            if ((string *)0x9 < psVar24) {
              psVar23 = psVar24;
              uVar42 = 4;
              do {
                uVar38 = uVar42;
                if (psVar23 < (string *)0x64) {
                  uVar38 = uVar38 - 2;
                  goto LAB_001f0ccd;
                }
                if (psVar23 < (string *)0x3e8) {
                  uVar38 = uVar38 - 1;
                  goto LAB_001f0ccd;
                }
                if (psVar23 < (string *)0x2710) goto LAB_001f0ccd;
                psVar28 = (string *)((ulong)psVar23 / 10000);
                bVar5 = (string *)0x1869f < psVar23;
                psVar23 = psVar28;
                uVar42 = uVar38 + 4;
              } while (bVar5);
              uVar38 = uVar38 + 1;
            }
LAB_001f0ccd:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar38 - (char)((long)psVar16 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar16 >> 0x3f),uVar38,
                       (unsigned_long_long)psVar24);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27ab54,(void *)0x1,(size_t)psVar23);
            psVar24 = (string *)-(long)local_2b8;
            if (0 < (long)local_2b8) {
              psVar24 = local_2b8;
            }
            uVar38 = 1;
            if ((string *)0x9 < psVar24) {
              psVar23 = psVar24;
              uVar42 = 4;
              do {
                uVar38 = uVar42;
                if (psVar23 < (string *)0x64) {
                  uVar38 = uVar38 - 2;
                  goto LAB_001f0dc0;
                }
                if (psVar23 < (string *)0x3e8) {
                  uVar38 = uVar38 - 1;
                  goto LAB_001f0dc0;
                }
                if (psVar23 < (string *)0x2710) goto LAB_001f0dc0;
                psVar16 = (string *)((ulong)psVar23 / 10000);
                bVar5 = (string *)0x1869f < psVar23;
                psVar23 = psVar16;
                uVar42 = uVar38 + 4;
              } while (bVar5);
              uVar38 = uVar38 + 1;
            }
LAB_001f0dc0:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar38 - (char)((long)local_2b8 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)local_2b8 >> 0x3f),uVar38,
                       (unsigned_long_long)psVar24);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27ae56,(void *)0x6,(size_t)psVar23);
            uVar38 = -uVar35;
            if (0 < (int)uVar35) {
              uVar38 = uVar35;
            }
            uVar42 = 1;
            if (9 < uVar38) {
              psVar24 = (string *)(ulong)uVar38;
              uVar7 = 4;
              do {
                uVar42 = uVar7;
                uVar11 = (uint)psVar24;
                if (uVar11 < 100) {
                  uVar42 = uVar42 - 2;
                  goto LAB_001f0eab;
                }
                if (uVar11 < 1000) {
                  uVar42 = uVar42 - 1;
                  goto LAB_001f0eab;
                }
                if (uVar11 < 10000) goto LAB_001f0eab;
                psVar24 = (string *)((ulong)psVar24 / 10000);
                psVar23 = psVar24;
                uVar7 = uVar42 + 4;
              } while (99999 < uVar11);
              uVar42 = uVar42 + 1;
            }
LAB_001f0eab:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar42 - (char)((int)uVar35 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (__str._M_dataplus._M_p + (uVar35 >> 0x1f),uVar42,uVar38);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27ae5d,(void *)0x4,(size_t)psVar23);
            psVar24 = (string *)((long)&(local_2b8->_M_dataplus)._M_p + local_248);
            psVar16 = (string *)-(long)psVar24;
            if (0 < (long)psVar24) {
              psVar16 = psVar24;
            }
            uVar35 = 1;
            psVar23 = local_2b8;
            if ((string *)0x9 < psVar16) {
              psVar23 = psVar16;
              uVar38 = 4;
              do {
                uVar35 = uVar38;
                if (psVar23 < (string *)0x64) {
                  uVar35 = uVar35 - 2;
                  goto LAB_001f0faa;
                }
                if (psVar23 < (string *)0x3e8) {
                  uVar35 = uVar35 - 1;
                  goto LAB_001f0faa;
                }
                if (psVar23 < (string *)0x2710) goto LAB_001f0faa;
                psVar28 = (string *)((ulong)psVar23 / 10000);
                bVar5 = (string *)0x1869f < psVar23;
                psVar23 = psVar28;
                uVar38 = uVar35 + 4;
              } while (bVar5);
              uVar35 = uVar35 + 1;
            }
LAB_001f0faa:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar35 - (char)((long)psVar24 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar24 >> 0x3f),uVar35,
                       (unsigned_long_long)psVar16);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27ab7b,(void *)0x4,(size_t)psVar23);
            uVar38 = (uint)uVar32;
            uVar35 = -uVar38;
            if (0 < (int)uVar38) {
              uVar35 = uVar38;
            }
            uVar42 = 1;
            if (9 < uVar35) {
              psVar24 = (string *)(ulong)uVar35;
              uVar7 = 4;
              do {
                uVar42 = uVar7;
                uVar11 = (uint)psVar24;
                if (uVar11 < 100) {
                  uVar42 = uVar42 - 2;
                  goto LAB_001f1093;
                }
                if (uVar11 < 1000) {
                  uVar42 = uVar42 - 1;
                  goto LAB_001f1093;
                }
                if (uVar11 < 10000) goto LAB_001f1093;
                psVar24 = (string *)((ulong)psVar24 / 10000);
                psVar23 = psVar24;
                uVar7 = uVar42 + 4;
              } while (99999 < uVar11);
              uVar42 = uVar42 + 1;
            }
LAB_001f1093:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar42 - ((char)(uVar32 >> 0x18) >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (__str._M_dataplus._M_p + (uVar38 >> 0x1f),uVar42,uVar35);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27ae62,(void *)0x4,(size_t)psVar23);
            psVar16 = (string *)((long)&(local_2b8->_M_dataplus)._M_p + local_298);
            psVar24 = (string *)-(long)psVar16;
            if (0 < (long)psVar16) {
              psVar24 = psVar16;
            }
            uVar35 = 1;
            if ((string *)0x9 < psVar24) {
              psVar23 = psVar24;
              uVar38 = 4;
              do {
                uVar35 = uVar38;
                if (psVar23 < (string *)0x64) {
                  uVar35 = uVar35 - 2;
                  goto LAB_001f1188;
                }
                if (psVar23 < (string *)0x3e8) {
                  uVar35 = uVar35 - 1;
                  goto LAB_001f1188;
                }
                if (psVar23 < (string *)0x2710) goto LAB_001f1188;
                psVar28 = (string *)((ulong)psVar23 / 10000);
                bVar5 = (string *)0x1869f < psVar23;
                psVar23 = psVar28;
                uVar38 = uVar35 + 4;
              } while (bVar5);
              uVar35 = uVar35 + 1;
            }
LAB_001f1188:
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&__str,(char)uVar35 - (char)((long)psVar16 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long_long>
                      (__str._M_dataplus._M_p + -((long)psVar16 >> 0x3f),uVar35,
                       (unsigned_long_long)psVar24);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                       (size_t)psVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
            }
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x27ad54,(void *)0x3,(size_t)psVar23);
          closeObject(this,objid);
          pCVar33 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pipeline;
          psVar23 = pCVar33->str;
          psVar19 = (size_type *)&pCVar33->count;
          if (psVar23 != (string *)0x0) {
            psVar19 = &psVar23->_M_string_length;
          }
          sVar43 = (sVar4 - *psVar19) + 200;
          if ((long)(sVar4 - *psVar19) < -200) {
            QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar43);
          }
          writePad(this,sVar43);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x27acb5,(void *)0x1,(size_t)psVar23);
          peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          ::qpdf::pl::Count::write
                    (peVar18->pipeline,(int)(peVar18->extra_header_text)._M_dataplus._M_p,
                     (void *)(peVar18->extra_header_text)._M_string_length,(size_t)psVar23);
          peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          psVar23 = peVar18->pipeline->str;
          psVar19 = (size_type *)&peVar18->pipeline->count;
          if (psVar23 != (string *)0x0) {
            psVar19 = &psVar23->_M_string_length;
          }
          psVar19 = (size_type *)*psVar19;
          if (iVar27 == 2) {
            lVar25 = *(long *)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            if (idx < (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar25 >> 5)) {
              pNVar15 = (NewObject *)(lVar25 + (long)idx * 0x20);
            }
            else {
              pNVar15 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            hint_offset = QPDFXRefEntry::getOffset(&pNVar15->xref);
          }
          else {
            hint_offset = 0;
          }
          if (bVar2 == false) {
            if (iVar27 == 1) {
              local_278 = 0x2000000;
            }
            pCVar33 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->pipeline;
            psVar23 = pCVar33->str;
            psVar17 = (size_type *)&pCVar33->count;
            if (psVar23 != (string *)0x0) {
              psVar17 = &psVar23->_M_string_length;
            }
            sVar4 = *psVar17;
            writeXRefStream(this,objid + 1,max_id,local_278,t_lin_first,objid,max_id,size,
                            (qpdf_offset_t)((long)&(local_2b8->_M_dataplus)._M_p + sVar36),hint_id,
                            hint_offset,(qpdf_offset_t)local_2b8,iVar27 == 1,iVar27);
            pCVar33 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->pipeline;
            psVar23 = pCVar33->str;
            psVar17 = (size_type *)&pCVar33->count;
            if (psVar23 != (string *)0x0) {
              psVar17 = &psVar23->_M_string_length;
            }
            sVar36 = *psVar17;
            if (iVar27 == 1) {
              lVar41 = sVar36 - sVar4;
              lVar25 = lVar41 + 0x7ffe;
              if (-1 < lVar41 + 0x3fff) {
                lVar25 = lVar41 + 0x3fff;
              }
              sVar43 = (lVar25 >> 0xe) * 5 + 0x10;
              if (lVar41 < -0x13ffe) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar43);
              }
              writePad(this,sVar43);
              pCVar33 = ((this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->pipeline;
              psVar23 = (string *)&pCVar33->str->_M_string_length;
              if (pCVar33->str == (string *)0x0) {
                psVar23 = (string *)&pCVar33->count;
              }
              local_260 = (psVar23->_M_dataplus)._M_p;
            }
            else {
              sVar43 = (long)local_260 - sVar36;
              if ((long)sVar43 < 0) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar43);
              }
              writePad(this,sVar43);
              pCVar33 = ((this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->pipeline;
              psVar23 = (string *)&pCVar33->str->_M_string_length;
              if (pCVar33->str == (string *)0x0) {
                psVar23 = (string *)&pCVar33->count;
              }
              if ((psVar23->_M_dataplus)._M_p != local_260) {
                plVar21 = (logic_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_f8,(longlong)local_260);
                std::operator+(&local_80,
                               "insufficient padding for first pass xref stream; first_xref_end=",
                               &local_f8);
                plVar20 = (long *)std::__cxx11::string::append((char *)&local_80);
                local_118._M_dataplus._M_p = (pointer)*plVar20;
                psVar19 = (size_type *)(plVar20 + 2);
                if ((size_type *)local_118._M_dataplus._M_p == psVar19) {
                  local_118.field_2._M_allocated_capacity = *psVar19;
                  local_118.field_2._8_8_ = plVar20[3];
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                }
                else {
                  local_118.field_2._M_allocated_capacity = *psVar19;
                }
                local_118._M_string_length = plVar20[1];
                *plVar20 = (long)psVar19;
                plVar20[1] = 0;
                *(undefined1 *)(plVar20 + 2) = 0;
                std::__cxx11::to_string(&local_a0,sVar36);
                std::operator+(&__str,&local_118,&local_a0);
                std::logic_error::logic_error(plVar21,(string *)&__str);
                __cxa_throw(plVar21,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
            ::qpdf::pl::Count::write(pCVar33,0x27acb5,(void *)0x1,(size_t)psVar23);
          }
          else {
            psVar23 = (string *)(ulong)max_id;
            writeXRefTable(this,t_lin_first,objid,max_id,size,
                           (qpdf_offset_t)((long)&(local_2b8->_M_dataplus)._M_p + sVar36),
                           iVar27 == 1,hint_id,hint_offset,(qpdf_offset_t)local_2b8,iVar27);
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27aeb2,(void *)0x12,(size_t)psVar23);
          }
          peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          pQVar31 = (peVar18->object_queue).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pQVar3 = *(pointer *)
                    ((long)&(peVar18->object_queue).
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data + 8);
          if (pQVar31 != pQVar3) {
            do {
              iVar10 = QPDFObjectHandle::getObjectID(pQVar31);
              if (iVar10 == iVar9) {
                pCVar33 = ((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->pipeline;
                psVar23 = pCVar33->str;
                psVar17 = (size_type *)&pCVar33->count;
                if (psVar23 != (string *)0x0) {
                  psVar17 = &psVar23->_M_string_length;
                }
                local_278 = *psVar17;
              }
              local_1c8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pQVar31->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_1c8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (pQVar31->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if (local_1c8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                psVar23 = (string *)&__libc_single_threaded;
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_1c8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_1c8.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_1c8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_1c8.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              writeObject(this,&local_1c8,-1);
              if (local_1c8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1c8.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              iVar10 = QPDFObjectHandle::getObjectID(pQVar31);
              if (iVar10 == iVar8) {
                if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->encrypted == true) {
                  writeEncryptionDictionary(this);
                }
                if (iVar27 == 1) {
                  peVar18 = (this->m).
                            super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr;
                  lVar25 = *(long *)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                     super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                     .
                                     super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                     ._M_impl;
                  psVar23 = peVar18->pipeline->str;
                  psVar17 = (size_type *)&peVar18->pipeline->count;
                  if (psVar23 != (string *)0x0) {
                    psVar17 = &psVar23->_M_string_length;
                  }
                  sVar36 = *psVar17;
                  psVar23 = (string *)
                            ((long)*(pointer *)
                                    ((long)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>
                                            .
                                            super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                            .
                                            super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                    + 8) - lVar25 >> 5);
                  if (idx < psVar23) {
                    psVar23 = (string *)((long)idx * 0x20);
                    pNVar15 = (NewObject *)((long)&(psVar23->_M_dataplus)._M_p + lVar25);
                  }
                  else {
                    pNVar15 = ObjTable<QPDFWriter::NewObject>::large_element
                                        (&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                         (size_t)idx);
                  }
                  (pNVar15->xref).type = 1;
                  (pNVar15->xref).field1 = sVar36;
                  (pNVar15->xref).field2 = 0;
                }
                else {
                  ::qpdf::pl::Count::write
                            (((this->m).
                              super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->pipeline,(int)hint_buffer._M_dataplus._M_p,
                             (void *)hint_buffer._M_string_length,(size_t)psVar23);
                }
              }
              iVar10 = QPDFObjectHandle::getObjectID(pQVar31);
              if (iVar10 == iVar9) {
                pCVar33 = ((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->pipeline;
                psVar23 = pCVar33->str;
                psVar17 = (size_type *)&pCVar33->count;
                if (psVar23 != (string *)0x0) {
                  psVar17 = &psVar23->_M_string_length;
                }
                local_248 = *psVar17;
              }
              pQVar31 = pQVar31 + 1;
            } while (pQVar31 != pQVar3);
            peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          }
          psVar23 = peVar18->pipeline->str;
          psVar17 = (size_type *)&peVar18->pipeline->count;
          if (psVar23 != (string *)0x0) {
            psVar17 = &psVar23->_M_string_length;
          }
          sVar36 = *psVar17;
          if (bVar2 == false) {
            local_298 = writeXRefStream(this,local_268,max_id_00,sVar36,t_lin_second,0,max_id_00,
                                        objid,0,0,0,0,iVar27 == 1,iVar27);
            pCVar33 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->pipeline;
            psVar23 = pCVar33->str;
            psVar17 = (size_type *)&pCVar33->count;
            if (psVar23 != (string *)0x0) {
              psVar17 = &psVar23->_M_string_length;
            }
            if (iVar27 == 1) {
              lVar41 = *psVar17 - sVar36;
              lVar25 = lVar41 + 0x7ffe;
              if (-1 < lVar41 + 0x3fff) {
                lVar25 = lVar41 + 0x3fff;
              }
              __n = lVar25 >> 0xe;
              sVar43 = __n * 5 + 0x10;
              if (lVar41 < -0x13ffe) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(sVar43);
              }
              writePad(this,sVar43);
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,0x27acb5,(void *)0x1,__n);
              pCVar33 = ((this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->pipeline;
              psVar17 = &pCVar33->str->_M_string_length;
              if (pCVar33->str == (string *)0x0) {
                psVar17 = (size_type *)&pCVar33->count;
              }
              local_258 = *psVar17;
            }
            else {
              puVar1 = (undefined *)((long)&(local_2b8->_M_dataplus)._M_p + local_258);
              nspaces = puVar1 + ~*psVar17;
              psVar23 = local_2b8;
              if ((long)nspaces < 0) {
                QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error((longlong)nspaces)
                ;
              }
              writePad(this,(size_t)nspaces);
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,0x27acb5,(void *)0x1,(size_t)psVar23);
              pCVar33 = ((this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->pipeline;
              psVar17 = &pCVar33->str->_M_string_length;
              if (pCVar33->str == (string *)0x0) {
                psVar17 = (size_type *)&pCVar33->count;
              }
              if ((undefined *)*psVar17 != puVar1) {
                plVar21 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error
                          (plVar21,
                           "count mismatch after xref stream; possible insufficient padding?");
                __cxa_throw(plVar21,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
          }
          else {
            psVar17 = (size_type *)(ulong)max_id_00;
            local_298 = writeXRefTable(this,t_lin_second,0,max_id_00,objid,0,false,0,0,0,iVar27);
            pCVar33 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->pipeline;
          }
          ::qpdf::pl::Count::write(pCVar33,0x27af06,(void *)0xa,(size_t)psVar17);
          __val = (size_type *)-(long)psVar19;
          if (0 < (long)psVar19) {
            __val = psVar19;
          }
          uVar35 = 1;
          if ((size_type *)0x9 < __val) {
            psVar17 = __val;
            uVar38 = 4;
            do {
              uVar35 = uVar38;
              if (psVar17 < (size_type *)0x64) {
                uVar35 = uVar35 - 2;
                goto LAB_001f1918;
              }
              if (psVar17 < (size_type *)0x3e8) {
                uVar35 = uVar35 - 1;
                goto LAB_001f1918;
              }
              if (psVar17 < (size_type *)0x2710) goto LAB_001f1918;
              psVar29 = (size_type *)((ulong)psVar17 / 10000);
              bVar5 = (size_type *)0x1869f < psVar17;
              psVar17 = psVar29;
              uVar38 = uVar35 + 4;
            } while (bVar5);
            uVar35 = uVar35 + 1;
          }
LAB_001f1918:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&__str,(char)uVar35 - (char)((long)psVar19 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long_long>
                    (__str._M_dataplus._M_p + -((long)psVar19 >> 0x3f),uVar35,
                     (unsigned_long_long)__val);
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,(int)__str._M_dataplus._M_p,(void *)__str._M_string_length,
                     (size_t)psVar17);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          ::qpdf::pl::Count::write
                    (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline,0x27aebd,(void *)0x7,(size_t)psVar17);
          if (iVar27 == 1) {
            peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            if (peVar18->deterministic_id == true) {
              computeDeterministicIDData(this);
              _Var6 = pp_md5;
              pp_md5._M_t.
              super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
              ._M_t.
              super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
              .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
                   (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
                    )(__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                      )0x0;
              if ((__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                   )_Var6._M_t.
                    super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                   )0x0) {
                PipelinePopper::~PipelinePopper
                          ((PipelinePopper *)
                           _Var6._M_t.
                           super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                           .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl)
                ;
                operator_delete((void *)_Var6._M_t.
                                        super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                        .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                                        _M_head_impl,0x10);
              }
              peVar18 = (this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (peVar18->md5_pipeline != (Pl_MD5 *)0x0) {
                __assert_fail("m->md5_pipeline == nullptr",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                              ,0xb57,"void QPDFWriter::writeLinearized()");
              }
            }
            _Var6._M_t.
            super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ._M_t.
            super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
            .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
                 pp_pass1._M_t.
                 super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl;
            psVar23 = peVar18->pipeline->str;
            psVar19 = (size_type *)&peVar18->pipeline->count;
            if (psVar23 != (string *)0x0) {
              psVar19 = &psVar23->_M_string_length;
            }
            local_230 = *psVar19;
            pp_pass1._M_t.
            super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ._M_t.
            super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
            .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl =
                 (__uniq_ptr_data<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>,_true,_true>
                  )(__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                    )0x0;
            if ((__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 )_Var6._M_t.
                  super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                  .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                 )0x0) {
              PipelinePopper::~PipelinePopper
                        ((PipelinePopper *)
                         _Var6._M_t.
                         super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                         .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>._M_head_impl);
              operator_delete((void *)_Var6._M_t.
                                      super___uniq_ptr_impl<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDFWriter::PipelinePopper_*,_std::default_delete<QPDFWriter::PipelinePopper>_>
                                      .super__Head_base<0UL,_QPDFWriter::PipelinePopper_*,_false>.
                                      _M_head_impl,0x10);
              peVar18 = (this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            }
            lVar25 = *(long *)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            if (idx < (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar25 >> 5)) {
              pNVar15 = (NewObject *)(lVar25 + (long)idx * 0x20);
            }
            else {
              pNVar15 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            uVar30 = QPDFXRefEntry::getOffset(&pNVar15->xref);
            __str._M_string_length = 0;
            __str._M_dataplus._M_p = (pointer)this;
            activatePipelineStack(this,(PipelinePopper *)&__str,&hint_buffer);
            writeHintStream(this,hint_id);
            PipelinePopper::~PipelinePopper((PipelinePopper *)&__str);
            sVar4 = hint_buffer._M_string_length;
            local_2b8 = (string *)hint_buffer._M_string_length;
            if ((long)hint_buffer._M_string_length < 0) {
              QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error
                        (hint_buffer._M_string_length);
            }
            peVar18 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            lVar25 = *(long *)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                               super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               .
                               super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                               ._M_impl;
            if (idx < (string *)
                      ((long)*(pointer *)
                              ((long)&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                      .
                                      super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                              + 8) - lVar25 >> 5)) {
              pNVar15 = (NewObject *)(lVar25 + (long)idx * 0x20);
            }
            else {
              pNVar15 = ObjTable<QPDFWriter::NewObject>::large_element
                                  (&(peVar18->new_obj).super_ObjTable<QPDFWriter::NewObject>,
                                   (size_t)idx);
            }
            (pNVar15->xref).type = 1;
            (pNVar15->xref).field1 = uVar30;
            (pNVar15->xref).field2 = 0;
            if (local_2b0 == (FILE *)0x0) {
              local_2b0 = (FILE *)0x0;
            }
            else {
              uVar32 = -uVar30;
              if (0 < (long)uVar30) {
                uVar32 = uVar30;
              }
              uVar35 = 1;
              if (9 < uVar32) {
                uVar26 = uVar32;
                uVar38 = 4;
                do {
                  uVar35 = uVar38;
                  if (uVar26 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_001f1bb6;
                  }
                  if (uVar26 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_001f1bb6;
                  }
                  if (uVar26 < 10000) goto LAB_001f1bb6;
                  bVar5 = 99999 < uVar26;
                  uVar26 = uVar26 / 10000;
                  uVar38 = uVar35 + 4;
                } while (bVar5);
                uVar35 = uVar35 + 1;
              }
LAB_001f1bb6:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar35 - (char)((long)uVar30 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)uVar30 >> 0x3f),uVar35,uVar32);
              fprintf(local_2b0,"%% hint_offset=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              uVar30 = -sVar4;
              if (0 < (long)sVar4) {
                uVar30 = sVar4;
              }
              uVar35 = 1;
              if (9 < uVar30) {
                uVar32 = uVar30;
                uVar38 = 4;
                do {
                  uVar35 = uVar38;
                  if (uVar32 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_001f1c88;
                  }
                  if (uVar32 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_001f1c88;
                  }
                  if (uVar32 < 10000) goto LAB_001f1c88;
                  bVar5 = 99999 < uVar32;
                  uVar32 = uVar32 / 10000;
                  uVar38 = uVar35 + 4;
                } while (bVar5);
                uVar35 = uVar35 + 1;
              }
LAB_001f1c88:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar35 - (char)((long)sVar4 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)sVar4 >> 0x3f),uVar35,uVar30);
              fprintf(local_2b0,"%% hint_length=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              uVar30 = -sVar36;
              if (0 < (long)sVar36) {
                uVar30 = sVar36;
              }
              uVar35 = 1;
              if (9 < uVar30) {
                uVar32 = uVar30;
                uVar38 = 4;
                do {
                  uVar35 = uVar38;
                  if (uVar32 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_001f1d5f;
                  }
                  if (uVar32 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_001f1d5f;
                  }
                  if (uVar32 < 10000) goto LAB_001f1d5f;
                  bVar5 = 99999 < uVar32;
                  uVar32 = uVar32 / 10000;
                  uVar38 = uVar35 + 4;
                } while (bVar5);
                uVar35 = uVar35 + 1;
              }
LAB_001f1d5f:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar35 - (char)((long)sVar36 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)sVar36 >> 0x3f),uVar35,uVar30);
              fprintf(local_2b0,"%% second_xref_offset=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              uVar30 = -local_258;
              if (0 < (long)local_258) {
                uVar30 = local_258;
              }
              uVar35 = 1;
              if (9 < uVar30) {
                uVar32 = uVar30;
                uVar38 = 4;
                do {
                  uVar35 = uVar38;
                  if (uVar32 < 100) {
                    uVar35 = uVar35 - 2;
                    goto LAB_001f1e34;
                  }
                  if (uVar32 < 1000) {
                    uVar35 = uVar35 - 1;
                    goto LAB_001f1e34;
                  }
                  if (uVar32 < 10000) goto LAB_001f1e34;
                  bVar5 = 99999 < uVar32;
                  uVar32 = uVar32 / 10000;
                  uVar38 = uVar35 + 4;
                } while (bVar5);
                uVar35 = uVar35 + 1;
              }
LAB_001f1e34:
              __str._M_dataplus._M_p = (pointer)&__str.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&__str,(char)uVar35 - (char)((long)local_258 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        (__str._M_dataplus._M_p + -((long)local_258 >> 0x3f),uVar35,uVar30);
              fprintf(local_2b0,"%% second_xref_end=%s\n",__str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str._M_dataplus._M_p != &__str.field_2) {
                operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
              }
              fclose(local_2b0);
              local_2b0 = (FILE *)0x0;
            }
          }
          lVar40 = lVar40 + 4;
          if (lVar40 == 8) {
            std::
            unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ::~unique_ptr(&pp_md5);
            std::
            unique_ptr<QPDFWriter::PipelinePopper,_std::default_delete<QPDFWriter::PipelinePopper>_>
            ::~unique_ptr(&pp_pass1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)hint_buffer._M_dataplus._M_p != &hint_buffer.field_2) {
              operator_delete(hint_buffer._M_dataplus._M_p,
                              CONCAT71(hint_buffer.field_2._M_allocated_capacity._1_7_,
                                       hint_buffer.field_2._M_local_buf[0]) + 1);
            }
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part9);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part8);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part7);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part6);
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&part4);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree(&stream_cache._M_t);
            return;
          }
        } while( true );
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"error encountered after writing part 9 of linearized data");
    }
    else {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"error encountered after writing part 6 of linearized data");
    }
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"error encountered after writing part 4 of linearized data");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFWriter::writeLinearized()
{
    // Optimize file and enqueue objects in order

    std::map<int, int> stream_cache;

    auto skip_stream_parameters = [this, &stream_cache](QPDFObjectHandle& stream) {
        auto& result = stream_cache[stream.getObjectID()];
        if (result == 0) {
            bool compress_stream;
            bool is_metadata;
            if (willFilterStream(stream, compress_stream, is_metadata, nullptr)) {
                result = 2;
            } else {
                result = 1;
            }
        }
        return result;
    };

    QPDF::Writer::optimize(m->pdf, m->obj, skip_stream_parameters);

    std::vector<QPDFObjectHandle> part4;
    std::vector<QPDFObjectHandle> part6;
    std::vector<QPDFObjectHandle> part7;
    std::vector<QPDFObjectHandle> part8;
    std::vector<QPDFObjectHandle> part9;
    QPDF::Writer::getLinearizedParts(m->pdf, m->obj, part4, part6, part7, part8, part9);

    // Object number sequence:
    //
    //  second half
    //    second half uncompressed objects
    //    second half xref stream, if any
    //    second half compressed objects
    //  first half
    //    linearization dictionary
    //    first half xref stream, if any
    //    part 4 uncompresesd objects
    //    encryption dictionary, if any
    //    hint stream
    //    part 6 uncompressed objects
    //    first half compressed objects
    //

    // Second half objects
    int second_half_uncompressed = QIntC::to_int(part7.size() + part8.size() + part9.size());
    int second_half_first_obj = 1;
    int after_second_half = 1 + second_half_uncompressed;
    m->next_objid = after_second_half;
    int second_half_xref = 0;
    bool need_xref_stream = !m->obj.streams_empty;
    if (need_xref_stream) {
        second_half_xref = m->next_objid++;
    }
    // Assign numbers to all compressed objects in the second half.
    std::vector<QPDFObjectHandle>* vecs2[] = {&part7, &part8, &part9};
    for (int i = 0; i < 3; ++i) {
        for (auto const& oh: *vecs2[i]) {
            assignCompressedObjectNumbers(oh.getObjGen());
        }
    }
    int second_half_end = m->next_objid - 1;
    int second_trailer_size = m->next_objid;

    // First half objects
    int first_half_start = m->next_objid;
    int lindict_id = m->next_objid++;
    int first_half_xref = 0;
    if (need_xref_stream) {
        first_half_xref = m->next_objid++;
    }
    int part4_first_obj = m->next_objid;
    m->next_objid += QIntC::to_int(part4.size());
    int after_part4 = m->next_objid;
    if (m->encrypted) {
        m->encryption_dict_objid = m->next_objid++;
    }
    int hint_id = m->next_objid++;
    int part6_first_obj = m->next_objid;
    m->next_objid += QIntC::to_int(part6.size());
    int after_part6 = m->next_objid;
    // Assign numbers to all compressed objects in the first half
    std::vector<QPDFObjectHandle>* vecs1[] = {&part4, &part6};
    for (int i = 0; i < 2; ++i) {
        for (auto const& oh: *vecs1[i]) {
            assignCompressedObjectNumbers(oh.getObjGen());
        }
    }
    int first_half_end = m->next_objid - 1;
    int first_trailer_size = m->next_objid;

    int part4_end_marker = part4.back().getObjectID();
    int part6_end_marker = part6.back().getObjectID();
    qpdf_offset_t space_before_zero = 0;
    qpdf_offset_t file_size = 0;
    qpdf_offset_t part6_end_offset = 0;
    qpdf_offset_t first_half_max_obj_offset = 0;
    qpdf_offset_t second_xref_offset = 0;
    qpdf_offset_t first_xref_end = 0;
    qpdf_offset_t second_xref_end = 0;

    m->next_objid = part4_first_obj;
    enqueuePart(part4);
    if (m->next_objid != after_part4) {
        // This can happen with very botched files as in the fuzzer test. There are likely some
        // faulty assumptions in calculateLinearizationData
        throw std::runtime_error("error encountered after writing part 4 of linearized data");
    }
    m->next_objid = part6_first_obj;
    enqueuePart(part6);
    if (m->next_objid != after_part6) {
        throw std::runtime_error("error encountered after writing part 6 of linearized data");
    }
    m->next_objid = second_half_first_obj;
    enqueuePart(part7);
    enqueuePart(part8);
    enqueuePart(part9);
    if (m->next_objid != after_second_half) {
        throw std::runtime_error("error encountered after writing part 9 of linearized data");
    }

    qpdf_offset_t hint_length = 0;
    std::string hint_buffer;

    // Write file in two passes.  Part numbers refer to PDF spec 1.4.

    FILE* lin_pass1_file = nullptr;
    auto pp_pass1 = std::make_unique<PipelinePopper>(this);
    auto pp_md5 = std::make_unique<PipelinePopper>(this);
    for (int pass: {1, 2}) {
        if (pass == 1) {
            if (!m->lin_pass1_filename.empty()) {
                lin_pass1_file = QUtil::safe_fopen(m->lin_pass1_filename.c_str(), "wb");
                pushPipeline(new Pl_StdioFile("linearization pass1", lin_pass1_file));
                activatePipelineStack(*pp_pass1);
            } else {
                activatePipelineStack(*pp_pass1, true);
            }
            if (m->deterministic_id) {
                pushMD5Pipeline(*pp_md5);
            }
        }

        // Part 1: header

        writeHeader();

        // Part 2: linearization parameter dictionary.  Save enough space to write real dictionary.
        // 200 characters is enough space if all numerical values in the parameter dictionary that
        // contain offsets are 20 digits long plus a few extra characters for safety.  The entire
        // linearization parameter dictionary must appear within the first 1024 characters of the
        // file.

        qpdf_offset_t pos = m->pipeline->getCount();
        openObject(lindict_id);
        writeString("<<");
        if (pass == 2) {
            std::vector<QPDFObjectHandle> const& pages = m->pdf.getAllPages();
            int first_page_object = m->obj[pages.at(0)].renumber;
            int npages = QIntC::to_int(pages.size());

            writeString(" /Linearized 1 /L ");
            writeString(std::to_string(file_size + hint_length));
            // Implementation note 121 states that a space is mandatory after this open bracket.
            writeString(" /H [ ");
            writeString(std::to_string(m->new_obj[hint_id].xref.getOffset()));
            writeString(" ");
            writeString(std::to_string(hint_length));
            writeString(" ] /O ");
            writeString(std::to_string(first_page_object));
            writeString(" /E ");
            writeString(std::to_string(part6_end_offset + hint_length));
            writeString(" /N ");
            writeString(std::to_string(npages));
            writeString(" /T ");
            writeString(std::to_string(space_before_zero + hint_length));
        }
        writeString(" >>");
        closeObject(lindict_id);
        static int const pad = 200;
        writePad(QIntC::to_size(pos - m->pipeline->getCount() + pad));
        writeString("\n");

        // If the user supplied any additional header text, write it here after the linearization
        // parameter dictionary.
        writeString(m->extra_header_text);

        // Part 3: first page cross reference table and trailer.

        qpdf_offset_t first_xref_offset = m->pipeline->getCount();
        qpdf_offset_t hint_offset = 0;
        if (pass == 2) {
            hint_offset = m->new_obj[hint_id].xref.getOffset();
        }
        if (need_xref_stream) {
            // Must pad here too.
            if (pass == 1) {
                // Set first_half_max_obj_offset to a value large enough to force four bytes to be
                // reserved for each file offset.  This would provide adequate space for the xref
                // stream as long as the last object in page 1 starts with in the first 4 GB of the
                // file, which is extremely likely.  In the second pass, we will know the actual
                // value for this, but it's okay if it's smaller.
                first_half_max_obj_offset = 1 << 25;
            }
            pos = m->pipeline->getCount();
            writeXRefStream(
                first_half_xref,
                first_half_end,
                first_half_max_obj_offset,
                t_lin_first,
                first_half_start,
                first_half_end,
                first_trailer_size,
                hint_length + second_xref_offset,
                hint_id,
                hint_offset,
                hint_length,
                (pass == 1),
                pass);
            qpdf_offset_t endpos = m->pipeline->getCount();
            if (pass == 1) {
                // Pad so we have enough room for the real xref stream.
                writePad(calculateXrefStreamPadding(endpos - pos));
                first_xref_end = m->pipeline->getCount();
            } else {
                // Pad so that the next object starts at the same place as in pass 1.
                writePad(QIntC::to_size(first_xref_end - endpos));

                if (m->pipeline->getCount() != first_xref_end) {
                    throw std::logic_error(
                        "insufficient padding for first pass xref stream; "
                        "first_xref_end=" +
                        std::to_string(first_xref_end) + "; endpos=" + std::to_string(endpos));
                }
            }
            writeString("\n");
        } else {
            writeXRefTable(
                t_lin_first,
                first_half_start,
                first_half_end,
                first_trailer_size,
                hint_length + second_xref_offset,
                (pass == 1),
                hint_id,
                hint_offset,
                hint_length,
                pass);
            writeString("startxref\n0\n%%EOF\n");
        }

        // Parts 4 through 9

        for (auto const& cur_object: m->object_queue) {
            if (cur_object.getObjectID() == part6_end_marker) {
                first_half_max_obj_offset = m->pipeline->getCount();
            }
            writeObject(cur_object);
            if (cur_object.getObjectID() == part4_end_marker) {
                if (m->encrypted) {
                    writeEncryptionDictionary();
                }
                if (pass == 1) {
                    m->new_obj[hint_id].xref = QPDFXRefEntry(m->pipeline->getCount());
                } else {
                    // Part 5: hint stream
                    writeString(hint_buffer);
                }
            }
            if (cur_object.getObjectID() == part6_end_marker) {
                part6_end_offset = m->pipeline->getCount();
            }
        }

        // Part 10: overflow hint stream -- not used

        // Part 11: main cross reference table and trailer

        second_xref_offset = m->pipeline->getCount();
        if (need_xref_stream) {
            pos = m->pipeline->getCount();
            space_before_zero = writeXRefStream(
                second_half_xref,
                second_half_end,
                second_xref_offset,
                t_lin_second,
                0,
                second_half_end,
                second_trailer_size,
                0,
                0,
                0,
                0,
                (pass == 1),
                pass);
            qpdf_offset_t endpos = m->pipeline->getCount();

            if (pass == 1) {
                // Pad so we have enough room for the real xref stream.  See comments for previous
                // xref stream on how we calculate the padding.
                writePad(calculateXrefStreamPadding(endpos - pos));
                writeString("\n");
                second_xref_end = m->pipeline->getCount();
            } else {
                // Make the file size the same.
                writePad(
                    QIntC::to_size(second_xref_end + hint_length - 1 - m->pipeline->getCount()));
                writeString("\n");

                // If this assertion fails, maybe we didn't have enough padding above.
                if (m->pipeline->getCount() != second_xref_end + hint_length) {
                    throw std::logic_error(
                        "count mismatch after xref stream; possible insufficient padding?");
                }
            }
        } else {
            space_before_zero = writeXRefTable(
                t_lin_second, 0, second_half_end, second_trailer_size, 0, false, 0, 0, 0, pass);
        }
        writeString("startxref\n");
        writeString(std::to_string(first_xref_offset));
        writeString("\n%%EOF\n");

        if (pass == 1) {
            if (m->deterministic_id) {
                QTC::TC("qpdf", "QPDFWriter linearized deterministic ID", need_xref_stream ? 0 : 1);
                computeDeterministicIDData();
                pp_md5 = nullptr;
                qpdf_assert_debug(m->md5_pipeline == nullptr);
            }

            // Close first pass pipeline
            file_size = m->pipeline->getCount();
            pp_pass1 = nullptr;

            // Save hint offset since it will be set to zero by calling openObject.
            qpdf_offset_t hint_offset1 = m->new_obj[hint_id].xref.getOffset();

            // Write hint stream to a buffer
            {
                PipelinePopper pp_hint(this);
                activatePipelineStack(pp_hint, hint_buffer);
                writeHintStream(hint_id);
            }
            hint_length = QIntC::to_offset(hint_buffer.size());

            // Restore hint offset
            m->new_obj[hint_id].xref = QPDFXRefEntry(hint_offset1);
            if (lin_pass1_file) {
                // Write some debugging information
                fprintf(
                    lin_pass1_file, "%% hint_offset=%s\n", std::to_string(hint_offset1).c_str());
                fprintf(lin_pass1_file, "%% hint_length=%s\n", std::to_string(hint_length).c_str());
                fprintf(
                    lin_pass1_file,
                    "%% second_xref_offset=%s\n",
                    std::to_string(second_xref_offset).c_str());
                fprintf(
                    lin_pass1_file,
                    "%% second_xref_end=%s\n",
                    std::to_string(second_xref_end).c_str());
                fclose(lin_pass1_file);
                lin_pass1_file = nullptr;
            }
        }
    }
}